

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

return_of_t<void_()> __thiscall
trompeloeil::mock_func<false,void()>
          (trompeloeil *this,char *param_2,char *param_3,undefined8 param_4,
          call_params_type_t<void_()> *param_5)

{
  char *name_;
  location loc_;
  tracer **pptVar1;
  undefined1 local_250 [8];
  trace_agent ta;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  call_matcher_base<void_()> *local_48;
  call_matcher_base<void_()> *i;
  undefined1 local_38 [7];
  call_params_type_t<void_()> param_value;
  unique_lock<std::recursive_mutex> lock;
  char *sig_name_local;
  char *func_name_local;
  expectations<false,_void_()> *e_local;
  
  get_lock<void>();
  memset((void *)((long)&i + 7),0,1);
  local_48 = find<void()>((call_matcher_list<void_()> *)this,
                          (call_params_type_t<void_()> *)((long)&i + 7));
  if (local_48 == (call_matcher_base<void_()> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8," with signature ",&local_a9);
    std::operator+(&local_88,param_2,&local_a8);
    std::operator+(&local_68,&local_88,param_3);
    report_mismatch<void()>
              (this,(call_matcher_list<void_()> *)(this + 0x18),
               (call_matcher_list<void_()> *)&local_68,(string *)((long)&i + 7),param_5);
  }
  report_match<void()>((call_matcher_list<void_()> *)this);
  loc_ = local_48->loc;
  name_ = local_48->name;
  pptVar1 = tracer_obj();
  trace_agent::trace_agent((trace_agent *)local_250,loc_,name_,*pptVar1);
  trace_agent::trace_params<>((trace_agent *)local_250,(tuple<> *)((long)&i + 7));
  (*(local_48->super_list_elem<trompeloeil::call_matcher_base<void_()>_>)._vptr_list_elem[5])
            (local_48,(long)&i + 7,this + 0x18);
  (*(local_48->super_list_elem<trompeloeil::call_matcher_base<void_()>_>)._vptr_list_elem[8])
            (local_48,local_250,(long)&i + 7);
  trace_agent::~trace_agent((trace_agent *)local_250);
  Catch::clara::std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_38);
  return;
}

Assistant:

return_of_t<Sig>
  mock_func(std::true_type,
            expectations<movable, Sig>& e,
            char const *func_name,
            char const *sig_name,
            P&& ... p)
  {
    auto lock = get_lock();

    call_params_type_t<void(P...)> param_value(std::forward<P>(p)...);

    auto i = find(e.active, param_value);
    if (!i)
    {
      report_mismatch(e.active,
                      e.saturated,
                      func_name + std::string(" with signature ") + sig_name,
                      param_value);
    }
    else{
        report_match(e.active);
    }
    trace_agent ta{i->loc, i->name, tracer_obj()};
    try
    {
      ta.trace_params(param_value);
      i->run_actions(param_value, e.saturated);
      return i->return_value(ta, param_value);
    }
    catch (...)
    {
      ta.trace_exception();
      throw;
    }
  }